

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderRenderCase::computeVertexReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  pointer pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  Vector<float,_4> *a;
  ulong uVar6;
  int iVar7;
  float fVar8;
  undefined4 extraout_var;
  int iVar9;
  int ix;
  int iVar10;
  int x;
  float fVar11;
  ulong uVar12;
  long lVar13;
  Vector<float,_4> *a_00;
  Vector<float,_4> *b;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint in_XMM2_Dc;
  Vec4 color;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vec4 color_1;
  Vec4 c11;
  Vec4 c10;
  Vec4 c01;
  ShaderEvalContext evalCtx;
  RGBA local_34c;
  ulong local_348;
  Vector<float,_4> local_340;
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_330;
  undefined1 local_318 [16];
  float local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined1 local_2f8 [16];
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  Vector<float,_4> local_2d0;
  Vector<float,_4> local_2c0;
  Vector<float,_4> local_2b0;
  Vector<float,_4> local_2a0;
  Vector<float,_4> local_290;
  Vec4 local_280;
  Vector<float,_4> local_270;
  Vector<float,_4> local_260;
  Vector<float,_4> local_250;
  ShaderEvalContext local_240;
  
  local_318._0_4_ = result->m_width;
  iVar3 = result->m_height;
  uVar4 = quadGrid->m_gridSize;
  fVar11 = (float)(uVar4 + 1);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0x14);
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_330,
             (long)((int)fVar11 * (int)fVar11),(allocator_type *)&local_340);
  fVar14 = (float)(int)uVar4;
  lVar13 = 0;
  local_308 = 0.0;
  if (0 < (int)fVar11) {
    local_308 = fVar11;
  }
  fVar8 = 0.0;
  local_348 = (ulong)uVar4;
  while (fVar8 != local_308) {
    local_2f8._0_4_ = fVar8;
    for (uVar12 = 0; (uint)fVar11 != uVar12; uVar12 = uVar12 + 1) {
      ShaderEvalContext::reset(&local_240,(float)(int)uVar12 / fVar14,(float)(int)fVar8 / fVar14);
      (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&local_240);
      tcu::Vector<float,_4>::Vector(&local_340,&local_240.color);
      if (iVar7 < 1) {
        local_340.m_data[3] = 1.0;
      }
      pVVar1 = local_330._M_impl.super__Vector_impl_data._M_start + ((int)uVar12 + (int)lVar13);
      pVVar1->m_data[0] = local_340.m_data[0];
      pVVar1->m_data[1] = local_340.m_data[1];
      pVVar1->m_data[2] = local_340.m_data[2];
      pVVar1->m_data[3] = local_340.m_data[3];
    }
    lVar13 = lVar13 + (ulong)(uint)fVar11;
    fVar8 = (float)(local_2f8._0_4_ + 1);
  }
  fVar8 = (float)(int)local_318._0_4_;
  iVar7 = 0;
  iVar9 = 0;
  if (0 < (int)local_348) {
    iVar9 = (int)local_348;
  }
  while (iVar7 != iVar9) {
    iVar2 = iVar7 + 1;
    fVar23 = ((float)iVar7 / fVar14) * (float)iVar3;
    fVar21 = ((float)iVar2 / fVar14) * (float)iVar3;
    fVar15 = ceilf(fVar23 + -0.5);
    fVar16 = ceilf(fVar21 + -0.5);
    local_2e8 = (ulong)(uint)(iVar7 * (int)fVar11);
    local_2e0 = (ulong)(uint)(iVar2 * (int)fVar11);
    uVar12 = 0;
    while (uVar6 = local_2e8, iVar7 = iVar2, uVar12 != local_348) {
      iVar10 = (int)uVar12;
      local_2d8 = uVar12 + 1;
      fVar24 = ((float)iVar10 / fVar14) * fVar8;
      fVar22 = ((float)(int)local_2d8 / fVar14) * fVar8;
      fVar17 = ceilf(fVar24 + -0.5);
      fVar18 = ceilf(fVar22 + -0.5);
      iVar7 = (int)local_2e0;
      tcu::Vector<float,_4>::Vector
                (&local_340,
                 local_330._M_impl.super__Vector_impl_data._M_start + ((int)uVar6 + iVar10));
      tcu::Vector<float,_4>::Vector
                (&local_250,
                 local_330._M_impl.super__Vector_impl_data._M_start + ((int)uVar6 + iVar10 + 1));
      tcu::Vector<float,_4>::Vector
                (&local_260,local_330._M_impl.super__Vector_impl_data._M_start + (iVar7 + iVar10));
      tcu::Vector<float,_4>::Vector
                (&local_270,
                 local_330._M_impl.super__Vector_impl_data._M_start + (iVar7 + iVar10 + 1));
      for (iVar7 = (int)fVar15; uVar12 = local_2d8, iVar7 < (int)fVar16; iVar7 = iVar7 + 1) {
        fVar25 = (((float)iVar7 + 0.5) - fVar23) * (1.0 / (fVar21 - fVar23));
        auVar19 = ZEXT812(0x3f800000);
        if (fVar25 <= 1.0) {
          auVar19._4_8_ = 0;
          auVar19._0_4_ = fVar25;
        }
        fVar25 = (float)(-(uint)(0.0 < fVar25) & auVar19._0_4_);
        in_XMM2_Dc = in_XMM2_Dc & auVar19._8_4_;
        local_318._4_4_ = 0;
        local_318._0_4_ = fVar25;
        local_318._8_4_ = in_XMM2_Dc;
        local_318._12_4_ = 0;
        for (iVar10 = (int)fVar17; iVar10 < (int)fVar18; iVar10 = iVar10 + 1) {
          fVar26 = (((float)iVar10 + 0.5) - fVar24) * (1.0 / (fVar22 - fVar24));
          auVar20 = ZEXT812(0x3f800000);
          if (fVar26 <= 1.0) {
            auVar20._4_8_ = 0;
            auVar20._0_4_ = fVar26;
          }
          local_308 = (float)(-(uint)(0.0 < fVar26) & auVar20._0_4_);
          local_2f8._4_4_ = 0;
          local_2f8._0_4_ = local_308;
          local_2f8._8_4_ = in_XMM2_Dc & auVar20._8_4_;
          local_2f8._12_4_ = 0;
          local_308 = (float)local_318._0_4_ + local_308;
          uStack_304 = local_318._4_4_;
          uStack_300 = local_318._8_4_;
          uStack_2fc = local_318._12_4_;
          bVar5 = 1.0 < local_308;
          fVar26 = (float)local_318._0_4_;
          if (bVar5) {
            fVar26 = 1.0 - fVar25;
          }
          b = &local_270;
          if (!bVar5) {
            b = &local_340;
          }
          a_00 = &local_250;
          a = &local_260;
          if (!bVar5) {
            a_00 = &local_260;
            a = &local_250;
          }
          tcu::operator-((tcu *)&local_2b0,a,b);
          in_XMM2_Dc = local_2f8._8_4_;
          tcu::operator*((tcu *)&local_2a0,
                         (float)(-(uint)(local_308 <= 1.0) & local_2f8._0_4_ |
                                ~-(uint)(local_308 <= 1.0) & (uint)(1.0 - (float)local_2f8._0_4_)),
                         &local_2b0);
          tcu::operator+((tcu *)&local_290,b,&local_2a0);
          tcu::operator-((tcu *)&local_2d0,a_00,b);
          tcu::operator*((tcu *)&local_2c0,fVar26,&local_2d0);
          tcu::operator+((tcu *)&local_280,&local_290,&local_2c0);
          tcu::RGBA::RGBA(&local_34c,&local_280);
          *(deUint32 *)
           ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar7 + iVar10) * 4) =
               local_34c.m_value;
        }
      }
    }
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_330);
  return;
}

Assistant:

void ShaderRenderCase::computeVertexReference (Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int					width		= result.getWidth();
	int					height		= result.getHeight();
	int					gridSize	= quadGrid.getGridSize();
	int					stride		= gridSize + 1;
	bool				hasAlpha	= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext	evalCtx		(quadGrid);

	// Evaluate color for each vertex.
	vector<Vec4> colors((gridSize+1)*(gridSize+1));
	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		float				sx			= (float)x / (float)gridSize;
		float				sy			= (float)y / (float)gridSize;
		int					vtxNdx		= ((y * (gridSize+1)) + x);

		evalCtx.reset(sx, sy);
		m_evaluator.evaluate(evalCtx);
		DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
		Vec4 color = evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		colors[vtxNdx] = color;
	}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		float x0 = (float)x       / (float)gridSize;
		float x1 = (float)(x + 1) / (float)gridSize;
		float y0 = (float)y       / (float)gridSize;
		float y1 = (float)(y + 1) / (float)gridSize;

		float sx0 = x0 * (float)width;
		float sx1 = x1 * (float)width;
		float sy0 = y0 * (float)height;
		float sy1 = y1 * (float)height;
		float oosx = 1.0f / (sx1 - sx0);
		float oosy = 1.0f / (sy1 - sy0);

		int ix0 = deCeilFloatToInt32(sx0 - 0.5f);
		int ix1 = deCeilFloatToInt32(sx1 - 0.5f);
		int iy0 = deCeilFloatToInt32(sy0 - 0.5f);
		int iy1 = deCeilFloatToInt32(sy1 - 0.5f);

		int		v00 = (y * stride) + x;
		int		v01 = (y * stride) + x + 1;
		int		v10 = ((y + 1) * stride) + x;
		int		v11 = ((y + 1) * stride) + x + 1;
		Vec4	c00 = colors[v00];
		Vec4	c01 = colors[v01];
		Vec4	c10 = colors[v10];
		Vec4	c11 = colors[v11];

		//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

		for (int iy = iy0; iy < iy1; iy++)
		for (int ix = ix0; ix < ix1; ix++)
		{
			DE_ASSERT(deInBounds32(ix, 0, width));
			DE_ASSERT(deInBounds32(iy, 0, height));

			float		sfx		= (float)ix + 0.5f;
			float		sfy		= (float)iy + 0.5f;
			float		fx1		= deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
			float		fy1		= deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

			// Triangle quad interpolation.
			bool		tri		= fx1 + fy1 <= 1.0f;
			float		tx		= tri ? fx1 : (1.0f-fx1);
			float		ty		= tri ? fy1 : (1.0f-fy1);
			const Vec4&	t0		= tri ? c00 : c11;
			const Vec4&	t1		= tri ? c01 : c10;
			const Vec4&	t2		= tri ? c10 : c01;
			Vec4		color	= t0 + (t1-t0)*tx + (t2-t0)*ty;

			result.setPixel(ix, iy, tcu::RGBA(color));
		}
	}
}